

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

bool cfd::core::TaprootUtil::IsValidLeafVersion(uint8_t leaf_version)

{
  uint32_t valid_ver;
  uint32_t *__end2;
  uint32_t *__begin2;
  uint32_t (*__range2) [9];
  uint8_t leaf_version_local;
  
  __end2 = IsValidLeafVersion::kValidLeafVersions;
  while( true ) {
    if (__end2 == (uint32_t *)&DAT_0085a454) {
      if ((uint)leaf_version % 2 == 0) {
        if ((leaf_version < 0xc0) || (0xfe < leaf_version)) {
          __range2._7_1_ = false;
        }
        else {
          __range2._7_1_ = true;
        }
      }
      else {
        __range2._7_1_ = false;
      }
      return __range2._7_1_;
    }
    if ((uint)leaf_version == *__end2) break;
    __end2 = __end2 + 1;
  }
  return true;
}

Assistant:

bool TaprootUtil::IsValidLeafVersion(uint8_t leaf_version) {
  // BIP-0341
  static const uint32_t kValidLeafVersions[] = {0x66, 0x7e, 0x80, 0x84, 0x96,
                                                0x98, 0xba, 0xbc, 0xbe};
  for (auto valid_ver : kValidLeafVersions) {
    if (leaf_version == valid_ver) return true;
  }

  if ((leaf_version % 2) != 0) return false;  // Odd
  if ((leaf_version >= 0xc0) && (leaf_version <= 0xfe)) return true;
  return false;
}